

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context_init__pulse(ma_context_config *pConfig,ma_context *pContext)

{
  int iVar1;
  ma_handle pvVar2;
  ma_proc p_Var3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  int error;
  ma_pa_context *pPulseContext;
  ma_pa_mainloop_api *pAPI;
  ma_pa_mainloop *pMainLoop;
  size_t i;
  char *libpulseNames [2];
  ma_context *pContext_local;
  ma_context_config *pConfig_local;
  
  libpulseNames[0] = "libpulse.so.0";
  for (pMainLoop = (ma_pa_mainloop *)0x0; pMainLoop < (ma_pa_mainloop *)0x2;
      pMainLoop = pMainLoop + 1) {
    pvVar2 = ma_dlopen(pContext,libpulseNames[(long)(pMainLoop + -1)]);
    (pContext->field_21).alsa.asoundSO = pvVar2;
    if ((pContext->field_21).alsa.asoundSO != (ma_handle)0x0) break;
  }
  if ((pContext->field_21).alsa.asoundSO == (ma_handle)0x0) {
    pConfig_local._4_4_ = -0x67;
  }
  else {
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_mainloop_new");
    (pContext->field_21).alsa.snd_pcm_open = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_mainloop_free");
    (pContext->field_21).alsa.snd_pcm_close = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_mainloop_get_api");
    (pContext->field_21).alsa.snd_pcm_hw_params_sizeof = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_mainloop_iterate");
    (pContext->field_21).alsa.snd_pcm_hw_params_any = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_mainloop_wakeup");
    (pContext->field_21).alsa.snd_pcm_hw_params_set_format = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_context_new");
    (pContext->field_21).alsa.snd_pcm_hw_params_set_format_first = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_context_unref");
    (pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_context_connect");
    (pContext->field_21).alsa.snd_pcm_hw_params_set_channels_near = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_context_disconnect");
    (pContext->field_21).alsa.snd_pcm_hw_params_set_rate_resample = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_context_set_state_callback");
    (pContext->field_21).alsa.snd_pcm_hw_params_set_rate_near = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_context_get_state");
    (pContext->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_context_get_sink_info_list");
    (pContext->field_21).alsa.snd_pcm_hw_params_set_periods_near = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_context_get_source_info_list")
    ;
    (pContext->field_21).alsa.snd_pcm_hw_params_set_access = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_context_get_sink_info_by_name"
                     );
    (pContext->field_21).alsa.snd_pcm_hw_params_get_format = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,
                      "pa_context_get_source_info_by_name");
    (pContext->field_21).alsa.snd_pcm_hw_params_get_channels = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_operation_unref");
    (pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_operation_get_state");
    (pContext->field_21).alsa.snd_pcm_hw_params_get_channels_max = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_channel_map_init_extend");
    (pContext->field_21).alsa.snd_pcm_hw_params_get_rate = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_channel_map_valid");
    (pContext->field_21).alsa.snd_pcm_hw_params_get_rate_min = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_channel_map_compatible");
    (pContext->field_21).alsa.snd_pcm_hw_params_get_rate_max = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_new");
    (pContext->field_21).alsa.snd_pcm_hw_params_get_buffer_size = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_unref");
    (pContext->field_21).alsa.snd_pcm_hw_params_get_periods = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_connect_playback");
    (pContext->field_21).alsa.snd_pcm_hw_params_get_access = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_connect_record");
    (pContext->field_21).alsa.snd_pcm_hw_params = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_disconnect");
    (pContext->field_21).alsa.snd_pcm_sw_params_sizeof = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_get_state");
    (pContext->field_21).alsa.snd_pcm_sw_params_current = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_get_sample_spec");
    (pContext->field_21).alsa.snd_pcm_sw_params_get_boundary = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_get_channel_map");
    (pContext->field_21).alsa.snd_pcm_sw_params_set_avail_min = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_get_buffer_attr");
    (pContext->field_21).alsa.snd_pcm_sw_params_set_start_threshold = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_set_buffer_attr");
    (pContext->field_21).alsa.snd_pcm_sw_params_set_stop_threshold = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_get_device_name");
    (pContext->field_21).alsa.snd_pcm_sw_params = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_set_write_callback");
    (pContext->field_21).alsa.snd_pcm_format_mask_sizeof = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_set_read_callback");
    (pContext->field_21).alsa.snd_pcm_format_mask_test = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_flush");
    (pContext->field_21).alsa.snd_pcm_get_chmap = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_drain");
    (pContext->field_21).alsa.snd_pcm_state = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_is_corked");
    (pContext->field_21).alsa.snd_pcm_prepare = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_cork");
    (pContext->field_21).alsa.snd_pcm_start = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_trigger");
    (pContext->field_21).alsa.snd_pcm_drop = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_begin_write");
    (pContext->field_21).alsa.snd_pcm_drain = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_write");
    (pContext->field_21).alsa.snd_device_name_hint = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_peek");
    (pContext->field_21).alsa.snd_device_name_get_hint = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_drop");
    (pContext->field_21).alsa.snd_card_get_index = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_writable_size");
    (pContext->field_21).alsa.snd_device_name_free_hint = p_Var3;
    p_Var3 = ma_dlsym(pContext,(pContext->field_21).alsa.asoundSO,"pa_stream_readable_size");
    (pContext->field_21).alsa.snd_pcm_mmap_begin = p_Var3;
    pContext->onUninit = ma_context_uninit__pulse;
    pContext->onDeviceIDEqual = ma_context_is_device_id_equal__pulse;
    pContext->onEnumDevices = ma_context_enumerate_devices__pulse;
    pContext->onGetDeviceInfo = ma_context_get_device_info__pulse;
    pContext->onDeviceInit = ma_device_init__pulse;
    pContext->onDeviceUninit = ma_device_uninit__pulse;
    pContext->onDeviceStart = (_func_ma_result_ma_device_ptr *)0x0;
    pContext->onDeviceStop = (_func_ma_result_ma_device_ptr *)0x0;
    pContext->onDeviceMainLoop = ma_device_main_loop__pulse;
    if ((pConfig->pulse).pApplicationName != (char *)0x0) {
      pcVar4 = ma_copy_string((pConfig->pulse).pApplicationName,&pContext->allocationCallbacks);
      (pContext->field_21).pulse.pApplicationName = pcVar4;
    }
    if ((pConfig->pulse).pServerName != (char *)0x0) {
      pcVar4 = ma_copy_string((pConfig->pulse).pServerName,&pContext->allocationCallbacks);
      (pContext->field_21).pulse.pServerName = pcVar4;
    }
    (pContext->field_21).pulse.tryAutoSpawn = (pConfig->pulse).tryAutoSpawn;
    lVar5 = (*(pContext->field_21).alsa.snd_pcm_open)();
    if (lVar5 == 0) {
      ma_free((pContext->field_21).alsa.snd_pcm_recover,&pContext->allocationCallbacks);
      ma_free((pContext->field_21).alsa.snd_pcm_mmap_commit,&pContext->allocationCallbacks);
      ma_dlclose(pContext,(pContext->field_21).alsa.asoundSO);
      pConfig_local._4_4_ = -0x67;
    }
    else {
      lVar6 = (*(pContext->field_21).alsa.snd_pcm_hw_params_sizeof)(lVar5);
      if (lVar6 == 0) {
        ma_free((pContext->field_21).alsa.snd_pcm_recover,&pContext->allocationCallbacks);
        ma_free((pContext->field_21).alsa.snd_pcm_mmap_commit,&pContext->allocationCallbacks);
        (*(pContext->field_21).alsa.snd_pcm_close)(lVar5);
        ma_dlclose(pContext,(pContext->field_21).alsa.asoundSO);
        pConfig_local._4_4_ = -0x67;
      }
      else {
        lVar6 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_format_first)
                          (lVar6,(pContext->field_21).alsa.snd_pcm_mmap_commit);
        if (lVar6 == 0) {
          ma_free((pContext->field_21).alsa.snd_pcm_recover,&pContext->allocationCallbacks);
          ma_free((pContext->field_21).alsa.snd_pcm_mmap_commit,&pContext->allocationCallbacks);
          (*(pContext->field_21).alsa.snd_pcm_close)(lVar5);
          ma_dlclose(pContext,(pContext->field_21).alsa.asoundSO);
          pConfig_local._4_4_ = -0x67;
        }
        else {
          iVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_set_channels_near)
                            (lVar6,(pContext->field_21).alsa.snd_pcm_recover,0,0);
          if (iVar1 == 0) {
            (*(pContext->field_21).alsa.snd_pcm_hw_params_set_rate_resample)(lVar6);
            (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)(lVar6);
            (*(pContext->field_21).alsa.snd_pcm_close)(lVar5);
            pConfig_local._4_4_ = 0;
          }
          else {
            ma_free((pContext->field_21).alsa.snd_pcm_recover,&pContext->allocationCallbacks);
            ma_free((pContext->field_21).alsa.snd_pcm_mmap_commit,&pContext->allocationCallbacks);
            (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)(lVar6);
            (*(pContext->field_21).alsa.snd_pcm_close)(lVar5);
            ma_dlclose(pContext,(pContext->field_21).alsa.asoundSO);
            pConfig_local._4_4_ = -0x67;
          }
        }
      }
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

static ma_result ma_context_init__pulse(const ma_context_config* pConfig, ma_context* pContext)
{
#ifndef MA_NO_RUNTIME_LINKING
    const char* libpulseNames[] = {
        "libpulse.so",
        "libpulse.so.0"
    };
    size_t i;

    for (i = 0; i < ma_countof(libpulseNames); ++i) {
        pContext->pulse.pulseSO = ma_dlopen(pContext, libpulseNames[i]);
        if (pContext->pulse.pulseSO != NULL) {
            break;
        }
    }

    if (pContext->pulse.pulseSO == NULL) {
        return MA_NO_BACKEND;
    }

    pContext->pulse.pa_mainloop_new                    = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_mainloop_new");
    pContext->pulse.pa_mainloop_free                   = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_mainloop_free");
    pContext->pulse.pa_mainloop_get_api                = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_mainloop_get_api");
    pContext->pulse.pa_mainloop_iterate                = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_mainloop_iterate");
    pContext->pulse.pa_mainloop_wakeup                 = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_mainloop_wakeup");
    pContext->pulse.pa_context_new                     = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_context_new");
    pContext->pulse.pa_context_unref                   = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_context_unref");
    pContext->pulse.pa_context_connect                 = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_context_connect");
    pContext->pulse.pa_context_disconnect              = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_context_disconnect");
    pContext->pulse.pa_context_set_state_callback      = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_context_set_state_callback");
    pContext->pulse.pa_context_get_state               = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_context_get_state");
    pContext->pulse.pa_context_get_sink_info_list      = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_context_get_sink_info_list");
    pContext->pulse.pa_context_get_source_info_list    = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_context_get_source_info_list");
    pContext->pulse.pa_context_get_sink_info_by_name   = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_context_get_sink_info_by_name");
    pContext->pulse.pa_context_get_source_info_by_name = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_context_get_source_info_by_name");
    pContext->pulse.pa_operation_unref                 = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_operation_unref");
    pContext->pulse.pa_operation_get_state             = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_operation_get_state");
    pContext->pulse.pa_channel_map_init_extend         = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_channel_map_init_extend");
    pContext->pulse.pa_channel_map_valid               = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_channel_map_valid");
    pContext->pulse.pa_channel_map_compatible          = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_channel_map_compatible");
    pContext->pulse.pa_stream_new                      = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_new");
    pContext->pulse.pa_stream_unref                    = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_unref");
    pContext->pulse.pa_stream_connect_playback         = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_connect_playback");
    pContext->pulse.pa_stream_connect_record           = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_connect_record");
    pContext->pulse.pa_stream_disconnect               = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_disconnect");
    pContext->pulse.pa_stream_get_state                = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_get_state");
    pContext->pulse.pa_stream_get_sample_spec          = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_get_sample_spec");
    pContext->pulse.pa_stream_get_channel_map          = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_get_channel_map");
    pContext->pulse.pa_stream_get_buffer_attr          = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_get_buffer_attr");
    pContext->pulse.pa_stream_set_buffer_attr          = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_set_buffer_attr");
    pContext->pulse.pa_stream_get_device_name          = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_get_device_name");
    pContext->pulse.pa_stream_set_write_callback       = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_set_write_callback");
    pContext->pulse.pa_stream_set_read_callback        = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_set_read_callback");
    pContext->pulse.pa_stream_flush                    = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_flush");
    pContext->pulse.pa_stream_drain                    = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_drain");
    pContext->pulse.pa_stream_is_corked                = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_is_corked");
    pContext->pulse.pa_stream_cork                     = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_cork");
    pContext->pulse.pa_stream_trigger                  = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_trigger");
    pContext->pulse.pa_stream_begin_write              = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_begin_write");
    pContext->pulse.pa_stream_write                    = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_write");
    pContext->pulse.pa_stream_peek                     = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_peek");
    pContext->pulse.pa_stream_drop                     = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_drop");
    pContext->pulse.pa_stream_writable_size            = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_writable_size");
    pContext->pulse.pa_stream_readable_size            = (ma_proc)ma_dlsym(pContext, pContext->pulse.pulseSO, "pa_stream_readable_size");
#else
    /* This strange assignment system is just for type safety. */
    ma_pa_mainloop_new_proc                    _pa_mainloop_new                   = pa_mainloop_new;
    ma_pa_mainloop_free_proc                   _pa_mainloop_free                  = pa_mainloop_free;
    ma_pa_mainloop_get_api_proc                _pa_mainloop_get_api               = pa_mainloop_get_api;
    ma_pa_mainloop_iterate_proc                _pa_mainloop_iterate               = pa_mainloop_iterate;
    ma_pa_mainloop_wakeup_proc                 _pa_mainloop_wakeup                = pa_mainloop_wakeup;
    ma_pa_context_new_proc                     _pa_context_new                    = pa_context_new;
    ma_pa_context_unref_proc                   _pa_context_unref                  = pa_context_unref;
    ma_pa_context_connect_proc                 _pa_context_connect                = pa_context_connect;
    ma_pa_context_disconnect_proc              _pa_context_disconnect             = pa_context_disconnect;
    ma_pa_context_set_state_callback_proc      _pa_context_set_state_callback     = pa_context_set_state_callback;
    ma_pa_context_get_state_proc               _pa_context_get_state              = pa_context_get_state;
    ma_pa_context_get_sink_info_list_proc      _pa_context_get_sink_info_list     = pa_context_get_sink_info_list;
    ma_pa_context_get_source_info_list_proc    _pa_context_get_source_info_list   = pa_context_get_source_info_list;
    ma_pa_context_get_sink_info_by_name_proc   _pa_context_get_sink_info_by_name  = pa_context_get_sink_info_by_name;
    ma_pa_context_get_source_info_by_name_proc _pa_context_get_source_info_by_name= pa_context_get_source_info_by_name;
    ma_pa_operation_unref_proc                 _pa_operation_unref                = pa_operation_unref;
    ma_pa_operation_get_state_proc             _pa_operation_get_state            = pa_operation_get_state;
    ma_pa_channel_map_init_extend_proc         _pa_channel_map_init_extend        = pa_channel_map_init_extend;
    ma_pa_channel_map_valid_proc               _pa_channel_map_valid              = pa_channel_map_valid;
    ma_pa_channel_map_compatible_proc          _pa_channel_map_compatible         = pa_channel_map_compatible;
    ma_pa_stream_new_proc                      _pa_stream_new                     = pa_stream_new;
    ma_pa_stream_unref_proc                    _pa_stream_unref                   = pa_stream_unref;
    ma_pa_stream_connect_playback_proc         _pa_stream_connect_playback        = pa_stream_connect_playback;
    ma_pa_stream_connect_record_proc           _pa_stream_connect_record          = pa_stream_connect_record;
    ma_pa_stream_disconnect_proc               _pa_stream_disconnect              = pa_stream_disconnect;
    ma_pa_stream_get_state_proc                _pa_stream_get_state               = pa_stream_get_state;
    ma_pa_stream_get_sample_spec_proc          _pa_stream_get_sample_spec         = pa_stream_get_sample_spec;
    ma_pa_stream_get_channel_map_proc          _pa_stream_get_channel_map         = pa_stream_get_channel_map;
    ma_pa_stream_get_buffer_attr_proc          _pa_stream_get_buffer_attr         = pa_stream_get_buffer_attr;
    ma_pa_stream_set_buffer_attr_proc          _pa_stream_set_buffer_attr         = pa_stream_set_buffer_attr;
    ma_pa_stream_get_device_name_proc          _pa_stream_get_device_name         = pa_stream_get_device_name;
    ma_pa_stream_set_write_callback_proc       _pa_stream_set_write_callback      = pa_stream_set_write_callback;
    ma_pa_stream_set_read_callback_proc        _pa_stream_set_read_callback       = pa_stream_set_read_callback;
    ma_pa_stream_flush_proc                    _pa_stream_flush                   = pa_stream_flush;
    ma_pa_stream_drain_proc                    _pa_stream_drain                   = pa_stream_drain;
    ma_pa_stream_is_corked_proc                _pa_stream_is_corked               = pa_stream_is_corked;
    ma_pa_stream_cork_proc                     _pa_stream_cork                    = pa_stream_cork;
    ma_pa_stream_trigger_proc                  _pa_stream_trigger                 = pa_stream_trigger;
    ma_pa_stream_begin_write_proc              _pa_stream_begin_write             = pa_stream_begin_write;
    ma_pa_stream_write_proc                    _pa_stream_write                   = pa_stream_write;
    ma_pa_stream_peek_proc                     _pa_stream_peek                    = pa_stream_peek;
    ma_pa_stream_drop_proc                     _pa_stream_drop                    = pa_stream_drop;
    ma_pa_stream_writable_size_proc            _pa_stream_writable_size           = pa_stream_writable_size;
    ma_pa_stream_readable_size_proc            _pa_stream_readable_size           = pa_stream_readable_size;

    pContext->pulse.pa_mainloop_new                    = (ma_proc)_pa_mainloop_new;
    pContext->pulse.pa_mainloop_free                   = (ma_proc)_pa_mainloop_free;
    pContext->pulse.pa_mainloop_get_api                = (ma_proc)_pa_mainloop_get_api;
    pContext->pulse.pa_mainloop_iterate                = (ma_proc)_pa_mainloop_iterate;
    pContext->pulse.pa_mainloop_wakeup                 = (ma_proc)_pa_mainloop_wakeup;
    pContext->pulse.pa_context_new                     = (ma_proc)_pa_context_new;
    pContext->pulse.pa_context_unref                   = (ma_proc)_pa_context_unref;
    pContext->pulse.pa_context_connect                 = (ma_proc)_pa_context_connect;
    pContext->pulse.pa_context_disconnect              = (ma_proc)_pa_context_disconnect;
    pContext->pulse.pa_context_set_state_callback      = (ma_proc)_pa_context_set_state_callback;
    pContext->pulse.pa_context_get_state               = (ma_proc)_pa_context_get_state;
    pContext->pulse.pa_context_get_sink_info_list      = (ma_proc)_pa_context_get_sink_info_list;
    pContext->pulse.pa_context_get_source_info_list    = (ma_proc)_pa_context_get_source_info_list;
    pContext->pulse.pa_context_get_sink_info_by_name   = (ma_proc)_pa_context_get_sink_info_by_name;
    pContext->pulse.pa_context_get_source_info_by_name = (ma_proc)_pa_context_get_source_info_by_name;
    pContext->pulse.pa_operation_unref                 = (ma_proc)_pa_operation_unref;
    pContext->pulse.pa_operation_get_state             = (ma_proc)_pa_operation_get_state;
    pContext->pulse.pa_channel_map_init_extend         = (ma_proc)_pa_channel_map_init_extend;
    pContext->pulse.pa_channel_map_valid               = (ma_proc)_pa_channel_map_valid;
    pContext->pulse.pa_channel_map_compatible          = (ma_proc)_pa_channel_map_compatible;
    pContext->pulse.pa_stream_new                      = (ma_proc)_pa_stream_new;
    pContext->pulse.pa_stream_unref                    = (ma_proc)_pa_stream_unref;
    pContext->pulse.pa_stream_connect_playback         = (ma_proc)_pa_stream_connect_playback;
    pContext->pulse.pa_stream_connect_record           = (ma_proc)_pa_stream_connect_record;
    pContext->pulse.pa_stream_disconnect               = (ma_proc)_pa_stream_disconnect;
    pContext->pulse.pa_stream_get_state                = (ma_proc)_pa_stream_get_state;
    pContext->pulse.pa_stream_get_sample_spec          = (ma_proc)_pa_stream_get_sample_spec;
    pContext->pulse.pa_stream_get_channel_map          = (ma_proc)_pa_stream_get_channel_map;
    pContext->pulse.pa_stream_get_buffer_attr          = (ma_proc)_pa_stream_get_buffer_attr;
    pContext->pulse.pa_stream_set_buffer_attr          = (ma_proc)_pa_stream_set_buffer_attr;
    pContext->pulse.pa_stream_get_device_name          = (ma_proc)_pa_stream_get_device_name;
    pContext->pulse.pa_stream_set_write_callback       = (ma_proc)_pa_stream_set_write_callback;
    pContext->pulse.pa_stream_set_read_callback        = (ma_proc)_pa_stream_set_read_callback;
    pContext->pulse.pa_stream_flush                    = (ma_proc)_pa_stream_flush;
    pContext->pulse.pa_stream_drain                    = (ma_proc)_pa_stream_drain;
    pContext->pulse.pa_stream_is_corked                = (ma_proc)_pa_stream_is_corked;
    pContext->pulse.pa_stream_cork                     = (ma_proc)_pa_stream_cork;
    pContext->pulse.pa_stream_trigger                  = (ma_proc)_pa_stream_trigger;
    pContext->pulse.pa_stream_begin_write              = (ma_proc)_pa_stream_begin_write;
    pContext->pulse.pa_stream_write                    = (ma_proc)_pa_stream_write;
    pContext->pulse.pa_stream_peek                     = (ma_proc)_pa_stream_peek;
    pContext->pulse.pa_stream_drop                     = (ma_proc)_pa_stream_drop;
    pContext->pulse.pa_stream_writable_size            = (ma_proc)_pa_stream_writable_size;
    pContext->pulse.pa_stream_readable_size            = (ma_proc)_pa_stream_readable_size;
#endif

    pContext->onUninit         = ma_context_uninit__pulse;
    pContext->onDeviceIDEqual  = ma_context_is_device_id_equal__pulse;
    pContext->onEnumDevices    = ma_context_enumerate_devices__pulse;
    pContext->onGetDeviceInfo  = ma_context_get_device_info__pulse;
    pContext->onDeviceInit     = ma_device_init__pulse;
    pContext->onDeviceUninit   = ma_device_uninit__pulse;
    pContext->onDeviceStart    = NULL;
    pContext->onDeviceStop     = NULL;
    pContext->onDeviceMainLoop = ma_device_main_loop__pulse;

    if (pConfig->pulse.pApplicationName) {
        pContext->pulse.pApplicationName = ma_copy_string(pConfig->pulse.pApplicationName, &pContext->allocationCallbacks);
    }
    if (pConfig->pulse.pServerName) {
        pContext->pulse.pServerName = ma_copy_string(pConfig->pulse.pServerName, &pContext->allocationCallbacks);
    }
    pContext->pulse.tryAutoSpawn = pConfig->pulse.tryAutoSpawn;
    
    /*
    Although we have found the libpulse library, it doesn't necessarily mean PulseAudio is useable. We need to initialize
    and connect a dummy PulseAudio context to test PulseAudio's usability.
    */
    {
        ma_pa_mainloop* pMainLoop;
        ma_pa_mainloop_api* pAPI;
        ma_pa_context* pPulseContext;
        int error;

        pMainLoop = ((ma_pa_mainloop_new_proc)pContext->pulse.pa_mainloop_new)();
        if (pMainLoop == NULL) {
            ma_free(pContext->pulse.pServerName, &pContext->allocationCallbacks);
            ma_free(pContext->pulse.pApplicationName, &pContext->allocationCallbacks);
        #ifndef MA_NO_RUNTIME_LINKING
            ma_dlclose(pContext, pContext->pulse.pulseSO);
        #endif
            return MA_NO_BACKEND;
        }

        pAPI = ((ma_pa_mainloop_get_api_proc)pContext->pulse.pa_mainloop_get_api)(pMainLoop);
        if (pAPI == NULL) {
            ma_free(pContext->pulse.pServerName, &pContext->allocationCallbacks);
            ma_free(pContext->pulse.pApplicationName, &pContext->allocationCallbacks);
            ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        #ifndef MA_NO_RUNTIME_LINKING
            ma_dlclose(pContext, pContext->pulse.pulseSO);
        #endif
            return MA_NO_BACKEND;
        }

        pPulseContext = ((ma_pa_context_new_proc)pContext->pulse.pa_context_new)(pAPI, pContext->pulse.pApplicationName);
        if (pPulseContext == NULL) {
            ma_free(pContext->pulse.pServerName, &pContext->allocationCallbacks);
            ma_free(pContext->pulse.pApplicationName, &pContext->allocationCallbacks);
            ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        #ifndef MA_NO_RUNTIME_LINKING
            ma_dlclose(pContext, pContext->pulse.pulseSO);
        #endif
            return MA_NO_BACKEND;
        }

        error = ((ma_pa_context_connect_proc)pContext->pulse.pa_context_connect)(pPulseContext, pContext->pulse.pServerName, 0, NULL);
        if (error != MA_PA_OK) {
            ma_free(pContext->pulse.pServerName, &pContext->allocationCallbacks);
            ma_free(pContext->pulse.pApplicationName, &pContext->allocationCallbacks);
            ((ma_pa_context_unref_proc)pContext->pulse.pa_context_unref)(pPulseContext);
            ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
        #ifndef MA_NO_RUNTIME_LINKING
            ma_dlclose(pContext, pContext->pulse.pulseSO);
        #endif
            return MA_NO_BACKEND;
        }

        ((ma_pa_context_disconnect_proc)pContext->pulse.pa_context_disconnect)(pPulseContext);
        ((ma_pa_context_unref_proc)pContext->pulse.pa_context_unref)(pPulseContext);
        ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)(pMainLoop);
    }

    return MA_SUCCESS;
}